

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::parlocalpar(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  char cVar1;
  uint uVar2;
  uint src;
  size_type sVar3;
  string *__range3;
  char cVar4;
  string localName;
  localVariable variable;
  
  requireDStackDepth(this,2,"(LOCAL)");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar2 != 0) {
    localName._M_dataplus._M_p = (pointer)&localName.field_2;
    localName._M_string_length = 0;
    localName.field_2._M_local_buf[0] = '\0';
    moveFromDataSpace(this,&localName,src,(ulong)uVar2);
    for (sVar3 = 0; localName._M_string_length != sVar3; sVar3 = sVar3 + 1) {
      cVar1 = localName._M_dataplus._M_p[sVar3];
      cVar4 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar4 = cVar1;
      }
      localName._M_dataplus._M_p[sVar3] = cVar4;
    }
    variable.localName._M_dataplus._M_p = (pointer)&variable.localName.field_2;
    variable.localName._M_string_length = 0;
    variable.localName.field_2._M_local_buf[0] = '\0';
    variable.localAddress = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&variable.localName,&localName);
    align(this);
    variable.localAddress = this->CellSize * 3 + this->dataPointer;
    std::vector<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>::
    push_back(&this->localVariables,&variable);
    data(this,0x18);
    data(this,5);
    data(this,this->CellSize * 3);
    data(this,4);
    data(this,(int)(((long)(this->localVariables).
                           super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->localVariables).
                          super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x28) - 1);
    std::__cxx11::string::~string((string *)&variable);
    std::__cxx11::string::~string((string *)&localName);
  }
  return;
}

Assistant:

void parlocalpar(){
			REQUIRE_DSTACK_DEPTH(2, "(LOCAL)");
			auto u=dStack.getTop(); dStack.pop();
			auto address=dStack.getTop(); dStack.pop();
			if(u>0){
			std::string localName{};
			moveFromDataSpace(localName,address,u);
			for(auto &c: localName) c=toupper_ascii(c);
			struct localVariable variable{};
			variable.localName=localName;
			align();// in case data() makes alignment;
			auto dataAddress=getDataPointer();
			variable.localAddress=dataAddress+CellSize*3;	
			localVariables.push_back(variable);		
			//data(doLiteralXt); // 1 literal
			//data(dataAddress+CellSize*6);  // 2 address
			//data(storeXt);  // 3 @
			data(localToReturnStackXt);
			data(branchXt);	// 4 	
			data(CellSize * 3);	// 5 Jump 5 to 8 
			data(4);			// 6
			data(localVariables.size()-1);	// 7 init by number of local variable (0,1,)
			}
		}